

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O0

real_t __thiscall xLearn::FMScore::CalcScore(FMScore *this,SparseRow *row,Model *model,real_t norm)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  index_t iVar7;
  pointer pNVar8;
  Model *in_RDX;
  float in_XMM0_Da;
  double dVar9;
  undefined1 auVar10 [64];
  real_t t_all;
  __m128 XMMwv;
  __m128 XMMw_1;
  __m128 XMMs_1;
  index_t d_1;
  __m128 XMMv_1;
  real_t *w_2;
  real_t v1_1;
  index_t j1_1;
  const_iterator iter_2;
  __m128 XMMt;
  __m128 XMMw;
  __m128 XMMs;
  index_t d;
  __m128 XMMv;
  real_t *w_1;
  real_t v1;
  index_t j1;
  const_iterator iter_1;
  real_t *s;
  vector<float,_std::allocator<float>_> sv;
  index_t align0;
  index_t aligned_k;
  index_t feat_id;
  const_iterator iter;
  index_t aux_size;
  real_t t;
  index_t num_feat;
  real_t *w;
  real_t sqrt_norm;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  float fVar11;
  undefined1 in_stack_fffffffffffffb88 [16];
  undefined1 in_stack_fffffffffffffb98 [16];
  undefined8 local_418;
  undefined8 uStack_410;
  float local_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  uint local_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  real_t *local_2d8;
  float local_2d0;
  uint local_2cc;
  Node *local_2c8;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_2c0;
  undefined8 local_2b8;
  vector<float,_std::allocator<float>_> *pvStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  uint local_27c;
  undefined1 local_278 [16];
  real_t *local_268;
  float local_260;
  uint local_25c;
  Node *local_258;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_250;
  float *local_248;
  undefined4 local_22c;
  int local_20c;
  index_t local_208;
  uint local_204;
  Node *local_200;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_1f8;
  int local_1ec;
  float local_1e8;
  index_t local_1e4;
  real_t *local_1e0;
  uint local_1d8;
  float local_1d4;
  Model *local_1d0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_15c;
  real_t *local_158;
  undefined1 (*local_150) [16];
  real_t *local_148;
  undefined1 (*local_140) [16];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 (*local_80) [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  vector<float,_std::allocator<float>_> *pvStack_10;
  float *local_8;
  undefined1 extraout_var [60];
  
  local_1d4 = in_XMM0_Da;
  local_1d0 = in_RDX;
  dVar9 = std::sqrt((double)(ulong)(uint)in_XMM0_Da);
  local_1d8 = SUB84(dVar9,0);
  local_1e0 = Model::GetParameter_w(local_1d0);
  local_1e4 = Model::GetNumFeature(local_1d0);
  local_1e8 = 0.0;
  auVar10._0_4_ = Model::GetAuxiliarySize(local_1d0);
  auVar10._4_60_ = extraout_var;
  local_1ec = vcvttss2usi_avx512f(auVar10._0_16_);
  local_1f8._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_fffffffffffffb78);
  while( true ) {
    local_200 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  (in_stack_fffffffffffffb78);
    bVar6 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)in_stack_fffffffffffffb78);
    if (!bVar6) break;
    pNVar8 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_1f8);
    local_204 = *(uint *)(pNVar8 + 4);
    if (local_204 < local_1e4) {
      pNVar8 = __gnu_cxx::
               __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
               ::operator->(&local_1f8);
      auVar1 = vfmadd213ss_fma(ZEXT416(local_1d8),
                               ZEXT416((uint)(*(float *)(pNVar8 + 8) *
                                             local_1e0[local_204 * local_1ec])),
                               ZEXT416((uint)local_1e8));
      local_1e8 = auVar1._0_4_;
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_1f8);
  }
  local_1e0 = Model::GetParameter_b(local_1d0);
  local_1e8 = local_1e8 + *local_1e0;
  local_208 = Model::get_aligned_k((Model *)0x1a9d14);
  iVar7 = Model::get_aligned_k((Model *)0x1a9d28);
  local_20c = iVar7 * local_1ec;
  local_22c = 0;
  std::allocator<float>::allocator((allocator<float> *)0x1a9d68);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffb98._8_8_,in_stack_fffffffffffffb98._0_8_,
             in_stack_fffffffffffffb88._8_8_,in_stack_fffffffffffffb88._0_8_);
  std::allocator<float>::~allocator((allocator<float> *)0x1a9d9c);
  local_248 = std::vector<float,_std::allocator<float>_>::data
                        ((vector<float,_std::allocator<float>_> *)0x1a9da9);
  local_250._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_fffffffffffffb78);
  while( true ) {
    local_258 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  (in_stack_fffffffffffffb78);
    bVar6 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)in_stack_fffffffffffffb78);
    if (!bVar6) break;
    pNVar8 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_250);
    local_25c = *(uint *)(pNVar8 + 4);
    if (local_25c < local_1e4) {
      pNVar8 = __gnu_cxx::
               __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
               ::operator->(&local_250);
      local_260 = *(float *)(pNVar8 + 8);
      local_268 = Model::GetParameter_v(local_1d0);
      local_268 = local_268 + local_25c * local_20c;
      local_178 = local_260 * local_1d4;
      local_278._8_8_ = CONCAT44(local_178,local_178);
      local_278._0_8_ = CONCAT44(local_178,local_178);
      for (local_27c = 0; fStack_174 = local_178, fStack_170 = local_178, fStack_16c = local_178,
          local_15c = local_178, local_27c < local_208; local_27c = local_27c + 4) {
        local_140 = (undefined1 (*) [16])(local_248 + local_27c);
        auVar1 = *local_140;
        local_148 = local_268 + local_27c;
        local_2a8 = *(undefined8 *)local_148;
        uStack_2a0 = *(undefined8 *)(local_148 + 2);
        local_a8._0_4_ = (float)local_2a8;
        local_a8._4_4_ = (float)((ulong)local_2a8 >> 0x20);
        uStack_a0._0_4_ = (float)uStack_2a0;
        uStack_a0._4_4_ = (float)((ulong)uStack_2a0 >> 0x20);
        local_118 = CONCAT44(local_a8._4_4_ * local_178,(float)local_a8 * local_178);
        uStack_110 = CONCAT44(uStack_a0._4_4_ * local_178,(float)uStack_a0 * local_178);
        local_108._0_4_ = (undefined4)*(undefined8 *)*local_140;
        local_108._4_4_ = (undefined4)((ulong)*(undefined8 *)*local_140 >> 0x20);
        fStack_100 = (float)*(undefined8 *)(*local_140 + 8);
        fStack_fc = (float)((ulong)*(undefined8 *)(*local_140 + 8) >> 0x20);
        local_298 = CONCAT44((float)local_108._4_4_ + local_a8._4_4_ * local_178,
                             (float)local_108._0_4_ + (float)local_a8 * local_178);
        uStack_290 = CONCAT44(fStack_fc + uStack_a0._4_4_ * local_178,
                              fStack_100 + (float)uStack_a0 * local_178);
        local_80 = (undefined1 (*) [16])(local_248 + local_27c);
        auVar3._8_8_ = uStack_290;
        auVar3._0_8_ = local_298;
        *local_80 = auVar3;
        _local_108 = auVar1;
        local_b8 = CONCAT44(local_178,local_178);
        uStack_b0 = CONCAT44(local_178,local_178);
        local_a8 = local_2a8;
        uStack_a0 = uStack_2a0;
        local_98 = local_298;
        uStack_90 = uStack_290;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_250);
  }
  local_17c = 0;
  local_198 = 0;
  uStack_194 = 0;
  uStack_190 = 0;
  uStack_18c = 0;
  local_2b8 = 0;
  pvStack_2b0 = (vector<float,_std::allocator<float>_> *)0x0;
  local_2c0._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_fffffffffffffb78);
  while( true ) {
    local_2c8 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  (in_stack_fffffffffffffb78);
    bVar6 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)in_stack_fffffffffffffb78);
    if (!bVar6) break;
    pNVar8 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_2c0);
    local_2cc = *(uint *)(pNVar8 + 4);
    if (local_2cc < local_1e4) {
      pNVar8 = __gnu_cxx::
               __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
               ::operator->(&local_2c0);
      local_2d0 = *(float *)(pNVar8 + 8);
      local_2d8 = Model::GetParameter_v(local_1d0);
      local_2d8 = local_2d8 + local_2cc * local_20c;
      local_1b8 = local_2d0 * local_1d4;
      local_2e8 = CONCAT44(local_1b8,local_1b8);
      uStack_2e0 = CONCAT44(local_1b8,local_1b8);
      for (local_2ec = 0; fStack_1b4 = local_1b8, fStack_1b0 = local_1b8, fStack_1ac = local_1b8,
          local_19c = local_1b8, local_2ec < local_208; local_2ec = local_2ec + 4) {
        local_150 = (undefined1 (*) [16])(local_248 + local_2ec);
        local_308 = *(undefined8 *)*local_150;
        uStack_300 = *(undefined8 *)(*local_150 + 8);
        local_158 = local_2d8 + local_2ec;
        local_318 = *(undefined8 *)local_158;
        uStack_310 = *(undefined8 *)(local_158 + 2);
        local_c8._0_4_ = (float)local_318;
        local_c8._4_4_ = (float)((ulong)local_318 >> 0x20);
        uStack_c0._0_4_ = (float)uStack_310;
        uStack_c0._4_4_ = (float)((ulong)uStack_310 >> 0x20);
        local_328 = CONCAT44(local_c8._4_4_ * local_1b8,(float)local_c8 * local_1b8);
        uStack_320 = CONCAT44(uStack_c0._4_4_ * local_1b8,(float)uStack_c0 * local_1b8);
        auVar4._8_8_ = uStack_320;
        auVar4._0_8_ = local_328;
        auVar1 = vsubps_avx(*local_150,auVar4);
        local_418 = auVar1._0_8_;
        uStack_410 = auVar1._8_8_;
        local_f8._0_4_ = auVar1._0_4_;
        local_f8._4_4_ = auVar1._4_4_;
        uStack_f0._0_4_ = auVar1._8_4_;
        uStack_f0._4_4_ = auVar1._12_4_;
        local_f8._0_4_ = (float)local_c8 * local_1b8 * (float)local_f8;
        local_f8._4_4_ = local_c8._4_4_ * local_1b8 * local_f8._4_4_;
        uStack_f0._0_4_ = (float)uStack_c0 * local_1b8 * (float)uStack_f0;
        uStack_f0._4_4_ = uStack_c0._4_4_ * local_1b8 * uStack_f0._4_4_;
        local_138 = CONCAT44(local_f8._4_4_,(float)local_f8);
        uStack_130 = CONCAT44(uStack_f0._4_4_,(float)uStack_f0);
        auVar2._8_8_ = pvStack_2b0;
        auVar2._0_8_ = local_2b8;
        local_128._0_4_ = (undefined4)local_2b8;
        local_128._4_4_ = (undefined4)((ulong)local_2b8 >> 0x20);
        fStack_120 = SUB84(pvStack_2b0,0);
        fStack_11c = (float)((ulong)pvStack_2b0 >> 0x20);
        local_2b8 = CONCAT44((float)local_128._4_4_ + local_f8._4_4_,
                             (float)local_128._0_4_ + (float)local_f8);
        pvStack_2b0 = (vector<float,_std::allocator<float>_> *)
                      CONCAT44(fStack_11c + uStack_f0._4_4_,fStack_120 + (float)uStack_f0);
        _local_128 = auVar2;
        local_f8 = local_418;
        uStack_f0 = uStack_410;
        local_e8 = local_328;
        uStack_e0 = uStack_320;
        local_d8 = local_2e8;
        uStack_d0 = uStack_2e0;
        local_c8 = local_318;
        uStack_c0 = uStack_310;
        local_78 = local_328;
        uStack_70 = uStack_320;
        local_68 = local_308;
        uStack_60 = uStack_300;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_2c0);
  }
  local_28 = local_2b8;
  uStack_20 = pvStack_2b0;
  local_38 = local_2b8;
  uStack_30 = pvStack_2b0;
  auVar5._8_8_ = pvStack_2b0;
  auVar5._0_8_ = local_2b8;
  auVar1._8_8_ = pvStack_2b0;
  auVar1._0_8_ = local_2b8;
  auVar1 = vhaddps_avx(auVar5,auVar1);
  local_58 = auVar1._0_8_;
  uStack_50 = auVar1._8_8_;
  auVar1 = vhaddps_avx(auVar1,auVar1);
  local_2b8 = auVar1._0_8_;
  pvStack_2b0 = auVar1._8_8_;
  local_8 = &local_32c;
  local_18._0_4_ = auVar1._0_4_;
  fVar11 = local_1e8 + (float)local_18 * 0.5;
  local_32c = fVar11;
  local_48 = local_58;
  uStack_40 = uStack_50;
  local_18 = local_2b8;
  pvStack_10 = pvStack_2b0;
  std::vector<float,_std::allocator<float>_>::~vector(pvStack_2b0);
  return fVar11;
}

Assistant:

real_t FMScore::CalcScore(const SparseRow* row,
                          Model& model,
                          real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  real_t t = 0;
  index_t aux_size = model.GetAuxiliarySize();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature in Prediction
    if (feat_id >= num_feat) continue;
    t += (iter->feat_val * w[feat_id*aux_size] * sqrt_norm);
  }
  // bias
  w = model.GetParameter_b();
  t += w[0];
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * aux_size;
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature in Prediction
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  __m128 XMMt = _mm_set1_ps(0.0f);
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature in Prediction
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w+d);
      __m128 XMMwv = _mm_mul_ps(XMMw, XMMv);
      XMMt = _mm_add_ps(XMMt,
         _mm_mul_ps(XMMwv, _mm_sub_ps(XMMs, XMMwv)));
    }
  }
  XMMt = _mm_hadd_ps(XMMt, XMMt);
  XMMt = _mm_hadd_ps(XMMt, XMMt);
  real_t t_all;
  _mm_store_ss(&t_all, XMMt);
  t_all *= 0.5;
  t_all += t;
  return t_all;
}